

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

void testDocumentRangeByte2(xmlParserCtxtPtr ctxt,char *document,int len,char *data)

{
  long lVar1;
  xmlDocPtr res;
  int j;
  int i;
  char *data_local;
  int len_local;
  char *document_local;
  xmlParserCtxtPtr ctxt_local;
  
  for (res._4_4_ = 0x80; (int)res._4_4_ < 0x100; res._4_4_ = res._4_4_ + 1) {
    for (res._0_4_ = 0; (int)(uint)res < 0x100; res._0_4_ = (uint)res + 1) {
      lastError = 0;
      xmlCtxtReset(ctxt);
      *data = (char)res._4_4_;
      data[1] = (char)(uint)res;
      lVar1 = xmlReadMemory(document,len,"test",0,0);
      if (((res._4_4_ & 0x80) == 0) || ((res._4_4_ & 0x40) != 0)) {
        if (((res._4_4_ & 0x80) == 0) || (((uint)res & 0xc0) == 0x80)) {
          if (((res._4_4_ & 0x80) == 0) || ((res._4_4_ & 0x1e) != 0)) {
            if ((res._4_4_ & 0xe0) == 0xe0) {
              if ((lastError == 0) || (lVar1 != 0)) {
                fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n",
                        (ulong)res._4_4_,(ulong)(uint)res);
              }
            }
            else if ((lastError != 0) || (lVar1 == 0)) {
              fprintf(_stderr,"Failed to parse document for Bytes 0x%02X 0x%02X\n",(ulong)res._4_4_,
                      (ulong)(uint)res);
            }
          }
          else if ((lastError == 0) || (lVar1 != 0)) {
            fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
                    (ulong)res._4_4_,(ulong)(uint)res);
          }
        }
        else if ((lastError == 0) || (lVar1 != 0)) {
          fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",(ulong)res._4_4_
                  ,(ulong)(uint)res);
        }
      }
      else if ((lastError == 0) || (lVar1 != 0)) {
        fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",(ulong)res._4_4_,
                (ulong)(uint)res);
      }
      if (lVar1 != 0) {
        xmlFreeDoc(lVar1);
      }
    }
  }
  return;
}

Assistant:

static void testDocumentRangeByte2(xmlParserCtxtPtr ctxt, char *document,
                  int len,  char *data) {
    int i, j;
    xmlDocPtr res;

    for (i = 0x80;i <= 0xFF;i++) {
    for (j = 0;j <= 0xFF;j++) {
	lastError = 0;
	xmlCtxtReset(ctxt);

        data[0] = i;
        data[1] = j;

	res = xmlReadMemory(document, len, "test", NULL, 0);

	/* if first bit of first char is set, then second bit must too */
	if ((i & 0x80) && ((i & 0x40) == 0)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
		"Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if first bit of first char is set, then second char first
	 * bits must be 10
	 */
	else if ((i & 0x80) && ((j & 0xC0) != 0x80)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if using a 2 byte encoding then the value must be greater
	 * than 0x80, i.e. one of bits 5 to 1 of i must be set
	 */
	else if ((i & 0x80) && ((i & 0x1E) == 0)) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X\n",
			i, j);
	}

	/*
	 * if third bit of first char is set, then the sequence would need
	 * at least 3 bytes, but we give only 2 !
	 */
	else if ((i & 0xE0) == 0xE0) {
	    if ((lastError == 0) || (res != NULL))
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x00\n",
			i, j);
	}

	/*
	 * We should see no error in remaining cases
	 */
	else if ((lastError != 0) || (res == NULL)) {
	    fprintf(stderr,
		"Failed to parse document for Bytes 0x%02X 0x%02X\n", i, j);
	}
	if (res != NULL)
	    xmlFreeDoc(res);
    }
    }
}